

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool_scheduler.cpp
# Opt level: O0

void __thiscall
async::detail::threadpool_data::threadpool_data
          (threadpool_data *this,size_t num_threads,function<void_()> *prerun_,
          function<void_()> *postrun_)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  task_wait_event **__p;
  function<void_()> *postrun__local;
  function<void_()> *prerun__local;
  size_t num_threads_local;
  threadpool_data *this_local;
  
  std::mutex::mutex(&this->lock);
  aligned_array<async::detail::thread_data_t,_64UL>::aligned_array(&this->thread_data,num_threads);
  fifo_queue::fifo_queue(&this->public_queue);
  this->shutdown = false;
  std::atomic<unsigned_long>::atomic(&this->num_waiters,0);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = num_threads;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  __p = (task_wait_event **)operator_new__(uVar2);
  std::
  unique_ptr<async::detail::task_wait_event*[],std::default_delete<async::detail::task_wait_event*[]>>
  ::
  unique_ptr<async::detail::task_wait_event**,std::default_delete<async::detail::task_wait_event*[]>,void,bool>
            ((unique_ptr<async::detail::task_wait_event*[],std::default_delete<async::detail::task_wait_event*[]>>
              *)&this->waiters,__p);
  std::function<void_()>::function(&this->prerun,prerun_);
  std::function<void_()>::function(&this->postrun,postrun_);
  return;
}

Assistant:

threadpool_data(std::size_t num_threads, std::function<void()>&& prerun_, std::function<void()>&& postrun_)
		: thread_data(num_threads), shutdown(false), num_waiters(0), waiters(new task_wait_event*[num_threads]),
          prerun(std::move(prerun_)), postrun(std::move(postrun_)) {}